

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::qr_solve
          (Epnp *this,Matrix<double,_6,_4,_0,_6,_4> *A_orig,Matrix<double,_6,_1,_0,_6,_1> *b,
          Matrix<double,_4,_1,_0,_4,_1> *X)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  undefined8 uVar13;
  double *pdVar14;
  long in_RAX;
  long lVar15;
  undefined1 *puVar16;
  ulong uVar17;
  double *pdVar18;
  int iVar19;
  long unaff_RBX;
  long lVar20;
  undefined1 *puVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar29 [64];
  
  local_140 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)(A_orig->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>
                                         ).m_storage.m_data.array + in_RAX));
  local_100 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)(A_orig->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>
                                         ).m_storage.m_data.array + unaff_RBX));
  local_c0 = vgatherdpd_avx512f(*(undefined4 *)
                                 ((long)(A_orig->
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>
                                        ).m_storage.m_data.array +
                                 (long)(b->
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)
                                       .m_storage.m_data.array));
  if (qr_solve(Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
      ::max_nr != '\x01') {
    qr_solve(Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
    ::max_nr = '\x01';
    qr_solve::A1 = (double *)operator_new__(0x30);
    qr_solve::A2 = (double *)operator_new__(0x30);
  }
  auVar42 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar26 = 1;
  pdVar18 = (double *)local_140;
  iVar25 = 0xa0;
  iVar19 = 0xc0;
  puVar21 = local_140 + 8;
  auVar43 = ZEXT864(0) << 0x40;
  uVar22 = 0;
  do {
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *pdVar18;
    uVar23 = uVar22 + 1;
    lVar15 = 0;
    auVar32 = vandpd_avx(auVar32,auVar42._0_16_);
    do {
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)pdVar18 + lVar15);
      lVar15 = lVar15 + 0x20;
      auVar33 = vandpd_avx(auVar33,auVar42._0_16_);
      auVar32 = vmaxsd_avx(auVar33,auVar32);
      dVar12 = auVar32._0_8_;
    } while (iVar25 != (int)lVar15);
    if ((dVar12 == 0.0) && (!NAN(dVar12))) {
      qr_solve::A2[uVar22 & 0xffffffff] = 0.0;
      qr_solve::A1[uVar22 & 0xffffffff] = 0.0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"God damnit, A is singular, this shouldn\'t happen.",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      return;
    }
    auVar32 = ZEXT816(0) << 0x40;
    lVar15 = 0;
    do {
      dVar31 = (1.0 / dVar12) * *(double *)((long)pdVar18 + lVar15);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar31;
      auVar32 = vfmadd231sd_fma(auVar32,auVar37,auVar37);
      *(double *)((long)pdVar18 + lVar15) = dVar31;
      lVar15 = lVar15 + 0x20;
    } while (iVar19 != (int)lVar15);
    if (auVar32._0_8_ < 0.0) {
      dVar31 = sqrt(auVar32._0_8_);
      auVar42 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      auVar43 = ZEXT864(0) << 0x40;
    }
    else {
      auVar32 = vsqrtsd_avx(auVar32,auVar32);
      dVar31 = auVar32._0_8_;
    }
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *pdVar18;
    uVar13 = vcmpsd_avx512f(auVar35,auVar43._0_16_,1);
    bVar27 = (bool)((byte)uVar13 & 1);
    dVar28 = (double)((ulong)bVar27 * (long)-dVar31 + (ulong)!bVar27 * (long)dVar31);
    dVar31 = *pdVar18 + dVar28;
    *pdVar18 = dVar31;
    dVar31 = dVar28 * dVar31;
    qr_solve::A1[uVar22] = dVar31;
    qr_solve::A2[uVar22] = dVar28 * -dVar12;
    pdVar14 = qr_solve::A1;
    puVar16 = puVar21;
    uVar17 = uVar26;
    if (uVar22 != 3) {
      do {
        auVar32 = ZEXT816(0) << 0x40;
        lVar15 = 0;
        do {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)pdVar18 + lVar15);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(puVar16 + lVar15);
          auVar32 = vfmadd231sd_fma(auVar32,auVar38,auVar2);
          lVar15 = lVar15 + 0x20;
        } while (iVar19 != (int)lVar15);
        auVar34._8_8_ = auVar32._8_8_ ^ 0x8000000000000000;
        lVar15 = 0;
        auVar34._0_8_ = -auVar32._0_8_ / dVar31;
        do {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)pdVar18 + lVar15);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(puVar16 + lVar15);
          auVar32 = vfmadd213sd_fma(auVar39,auVar34,auVar3);
          *(long *)(puVar16 + lVar15) = auVar32._0_8_;
          lVar15 = lVar15 + 0x20;
        } while (iVar19 != (int)lVar15);
        puVar16 = puVar16 + 8;
        bVar27 = uVar17 < 3;
        uVar17 = uVar17 + 1;
      } while (bVar27);
    }
    pdVar18 = pdVar18 + 5;
    uVar26 = uVar26 + 1;
    iVar25 = iVar25 + -0x20;
    iVar19 = iVar19 + -0x20;
    puVar21 = puVar21 + 0x28;
    uVar22 = uVar23;
  } while (uVar23 != 4);
  auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  puVar21 = local_140;
  lVar15 = 0x30;
  lVar20 = 0;
  pdVar18 = (double *)b;
  do {
    auVar32 = ZEXT816(0) << 0x40;
    lVar24 = 0;
    do {
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(puVar21 + lVar24 * 4);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)pdVar18 + lVar24);
      auVar32 = vfmadd231sd_fma(auVar32,auVar41,auVar4);
      lVar24 = lVar24 + 8;
    } while (lVar15 != lVar24);
    auVar40._8_8_ = auVar32._8_8_ ^ 0x8000000000000000;
    auVar40._0_8_ = -auVar32._0_8_ / pdVar14[lVar20];
    pdVar18 = pdVar18 + 1;
    lVar15 = lVar15 + -8;
    auVar43 = vpbroadcastq_avx512f();
    uVar22 = vpcmpuq_avx512f(auVar43,auVar42,5);
    pdVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array + lVar20;
    bVar6 = (byte)uVar22;
    auVar43._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * (long)pdVar1[1];
    auVar43._0_8_ = (ulong)(bVar6 & 1) * (long)*pdVar1;
    auVar43._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * (long)pdVar1[2];
    auVar43._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * (long)pdVar1[3];
    auVar43._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * (long)pdVar1[4];
    auVar43._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * (long)pdVar1[5];
    auVar43._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * (long)pdVar1[6];
    auVar43._56_8_ = (uVar22 >> 7) * (long)pdVar1[7];
    auVar29 = vgatherdpd_avx512f(*(undefined4 *)(puVar21 + lVar15));
    auVar30._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * auVar29._8_8_;
    auVar30._0_8_ = (ulong)(bVar6 & 1) * auVar29._0_8_;
    auVar30._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * auVar29._16_8_;
    auVar30._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * auVar29._24_8_;
    auVar30._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * auVar29._32_8_;
    auVar30._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * auVar29._40_8_;
    auVar30._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * auVar29._48_8_;
    auVar30._56_8_ = (uVar22 >> 7) * auVar29._56_8_;
    puVar21 = puVar21 + 0x28;
    auVar29 = vbroadcastsd_avx512f(auVar40);
    auVar43 = vfmadd231pd_avx512f(auVar43,auVar29,auVar30);
    pdVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array + lVar20;
    bVar27 = (bool)((byte)(uVar22 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
    bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
    bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
    bVar10 = (bool)((byte)(uVar22 >> 5) & 1);
    bVar11 = (bool)((byte)(uVar22 >> 6) & 1);
    *pdVar1 = (double)((ulong)(bVar6 & 1) * auVar43._0_8_ |
                      (ulong)!(bool)(bVar6 & 1) * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar27 * auVar43._8_8_ | (ulong)!bVar27 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar7 * auVar43._16_8_ | (ulong)!bVar7 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar8 * auVar43._24_8_ | (ulong)!bVar8 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar9 * auVar43._32_8_ | (ulong)!bVar9 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar10 * auVar43._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar11 * auVar43._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar22 >> 7) * auVar43._56_8_ |
                        (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar1[7]);
    pdVar1 = qr_solve::A2;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  pdVar18 = (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
            + 3;
  lVar15 = 2;
  lVar20 = 8;
  puVar21 = local_100 + 0x18;
  (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
       (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] /
       qr_solve::A2[3];
  do {
    auVar32 = ZEXT816(0) << 0x40;
    lVar24 = 0;
    do {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(puVar21 + lVar24);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)((long)pdVar18 + lVar24);
      auVar32 = vfmadd231sd_fma(auVar32,auVar36,auVar5);
      lVar24 = lVar24 + 8;
    } while (lVar20 != lVar24);
    pdVar18 = pdVar18 + -1;
    lVar20 = lVar20 + 8;
    puVar21 = puVar21 + -0x28;
    (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[lVar15]
         = ((b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
            [lVar15] - auVar32._0_8_) / pdVar1[lVar15];
    bVar27 = lVar15 != 0;
    lVar15 = lVar15 + -1;
  } while (bVar27);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::qr_solve(
    Eigen::Matrix<double,6,4> & A_orig,
    Eigen::Matrix<double,6,1> & b,
    Eigen::Matrix<double,4,1> & X)
{
  Eigen::Matrix<double,4,6> A = A_orig.transpose();

  static int max_nr = 0;
  static double * A1, * A2;

  const int nr = A_orig.rows();
  const int nc = A_orig.cols();

  if (max_nr != 0 && max_nr < nr)
  {
    delete [] A1;
    delete [] A2;
  }
  if (max_nr < nr)
  {
    max_nr = nr;
    A1 = new double[nr];
    A2 = new double[nr];
  }

  double * pA = A.data(), * ppAkk = pA;
  for(int k = 0; k < nc; k++)
  {
    double * ppAik = ppAkk, eta = fabs(*ppAik);
    for(int i = k + 1; i < nr; i++)
    {
      double elt = fabs(*ppAik);
      if (eta < elt) eta = elt;
      ppAik += nc;
    }

    if (eta == 0)
    {
      A1[k] = A2[k] = 0.0;
      cerr << "God damnit, A is singular, this shouldn't happen." << endl;
      return;
    }
    else
    {
      double * ppAik = ppAkk, sum = 0.0, inv_eta = 1. / eta;
      for(int i = k; i < nr; i++)
      {
        *ppAik *= inv_eta;
        sum += *ppAik * *ppAik;
        ppAik += nc;
      }
      double sigma = sqrt(sum);
      if (*ppAkk < 0)
        sigma = -sigma;
      *ppAkk += sigma;
      A1[k] = sigma * *ppAkk;
      A2[k] = -eta * sigma;
      for(int j = k + 1; j < nc; j++)
      {
        double * ppAik = ppAkk, sum = 0;
        for(int i = k; i < nr; i++)
        {
          sum += *ppAik * ppAik[j - k];
          ppAik += nc;
        }
        double tau = sum / A1[k];
        ppAik = ppAkk;
        for(int i = k; i < nr; i++)
        {
          ppAik[j - k] -= tau * *ppAik;
          ppAik += nc;
        }
      }
    }
    ppAkk += nc + 1;
  }

  // b <- Qt b
  double * ppAjj = pA, * pb = b.data();
  for(int j = 0; j < nc; j++)
  {
    double * ppAij = ppAjj, tau = 0;
    for(int i = j; i < nr; i++)
    {
      tau += *ppAij * pb[i];
      ppAij += nc;
    }
    tau /= A1[j];
    ppAij = ppAjj;
    for(int i = j; i < nr; i++)
    {
      pb[i] -= tau * *ppAij;
      ppAij += nc;
    }
    ppAjj += nc + 1;
  }

  // X = R-1 b
  double * pX = X.data();
  pX[nc - 1] = pb[nc - 1] / A2[nc - 1];
  for(int i = nc - 2; i >= 0; i--)
  {
    double * ppAij = pA + i * nc + (i + 1), sum = 0;

    for(int j = i + 1; j < nc; j++)
    {
      sum += *ppAij * pX[j];
      ppAij++;
    }
    pX[i] = (pb[i] - sum) / A2[i];
  }
}